

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GeometryShaderMaxShaderStorageBlocksTest::iterate
          (GeometryShaderMaxShaderStorageBlocksTest *this)

{
  ostringstream *poVar1;
  ulong uVar2;
  GLuint *pGVar3;
  uint uVar4;
  GLint GVar5;
  GeometryShaderMaxShaderStorageBlocksTest *pGVar6;
  bool bVar7;
  int iVar8;
  deUint32 dVar9;
  GLuint GVar10;
  undefined4 extraout_var;
  MessageBuilder *pMVar12;
  NotSupportedError *pNVar13;
  void *pvVar14;
  float *pfVar15;
  long lVar16;
  ulong uVar17;
  char *description;
  long lVar18;
  qpTestResult testResult;
  GLint n_ssb;
  ulong uVar19;
  bool has_shader_compilation_failed;
  GLint ssbo_alignment;
  GLint *local_278;
  float local_26c;
  allocator<char> local_265;
  GLint m_gl_max_shader_storage_buffer_bindings_value;
  long local_260;
  GeometryShaderMaxShaderStorageBlocksTest *local_258;
  ulong local_250;
  char *gs_code_specialized_raw;
  char *fs_code_specialized_raw;
  char *vs_code_specialized_raw;
  GLchar *feedbackVaryings [1];
  GLfloat initial_buffer_data [4];
  string vs_code_specialized;
  string gs_code_specialized;
  string fs_code_specialized;
  undefined1 local_1b0 [8];
  ostream local_1a8;
  long lVar11;
  
  feedbackVaryings[0] = "gl_Position";
  has_shader_compilation_failed = true;
  initial_buffer_data[0] = 0.0;
  initial_buffer_data[1] = 0.0;
  initial_buffer_data[2] = 0.0;
  initial_buffer_data[3] = 0.0;
  ssbo_alignment = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs_code_specialized,fixed_sample_locations_values + 1,
             (allocator<char> *)local_1b0);
  fs_code_specialized_raw = (char *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gs_code_specialized,fixed_sample_locations_values + 1,
             (allocator<char> *)local_1b0);
  gs_code_specialized_raw = (char *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vs_code_specialized,fixed_sample_locations_values + 1,
             (allocator<char> *)local_1b0);
  vs_code_specialized_raw = (char *)0x0;
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar13,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
               ,0x765);
    __cxa_throw(pNVar13,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar8 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar8);
  local_278 = &this->m_gl_max_geometry_shader_storage_blocks_ext_value;
  (**(code **)(lVar11 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_SHADER_STORAGE_BLOCKS);
  dVar9 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar9,"glGetIntegerv() failed for GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT pname"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x76d);
  m_gl_max_shader_storage_buffer_bindings_value = 0;
  (**(code **)(lVar11 + 0x868))(0x90dd);
  dVar9 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar9,"glGetIntegerv() failed for GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x773);
  if (*local_278 < 1) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::operator<<(&local_1a8,"GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT query value ");
    std::operator<<(&local_1a8,"[");
    pMVar12 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,local_278);
    std::operator<<(&(pMVar12->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    "] is less than or equal zero. Shader Storage Blocks in Geometry Shader are not supported."
                   );
    tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    if (*local_278 == 0) {
      pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,"GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT is 0",&local_265);
      tcu::NotSupportedError::NotSupportedError(pNVar13,(string *)local_1b0);
      __cxa_throw(pNVar13,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  else {
    if (m_gl_max_shader_storage_buffer_bindings_value < *local_278) {
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<(&local_1a8,"GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT query value ");
      std::operator<<(&local_1a8,"[");
      pMVar12 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,local_278);
      poVar1 = &pMVar12->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      "] is greater than GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS query value [");
      std::ostream::operator<<(poVar1,m_gl_max_shader_storage_buffer_bindings_value);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"].");
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      GVar10 = (**(code **)(lVar11 + 0x3c8))();
      this->m_po_id = GVar10;
      dVar9 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar9,"glCreateProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0x79a);
      GVar10 = (**(code **)(lVar11 + 0x3f0))(0x8b30);
      this->m_fs_id = GVar10;
      GVar10 = (**(code **)(lVar11 + 0x3f0))(0x8dd9);
      this->m_gs_id = GVar10;
      GVar10 = (**(code **)(lVar11 + 0x3f0))(0x8b31);
      this->m_vs_id = GVar10;
      dVar9 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar9,"glCreateShader() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0x7a1);
      (**(code **)(lVar11 + 0x14c8))(this->m_po_id,1,feedbackVaryings,0x8c8c);
      dVar9 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar9,"glTransformFeedbackVaryings() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0x7a6);
      TestCaseBase::specializeShader_abi_cxx11_
                ((string *)local_1b0,&this->super_TestCaseBase,1,&dummy_fs_code);
      std::__cxx11::string::operator=((string *)&fs_code_specialized,(string *)local_1b0);
      std::__cxx11::string::~string((string *)local_1b0);
      fs_code_specialized_raw = fs_code_specialized._M_dataplus._M_p;
      getGSCode_abi_cxx11_((string *)local_1b0,this);
      std::__cxx11::string::operator=((string *)&gs_code_specialized,(string *)local_1b0);
      std::__cxx11::string::~string((string *)local_1b0);
      gs_code_specialized_raw = gs_code_specialized._M_dataplus._M_p;
      TestCaseBase::specializeShader_abi_cxx11_
                ((string *)local_1b0,&this->super_TestCaseBase,1,&dummy_vs_code);
      std::__cxx11::string::operator=((string *)&vs_code_specialized,(string *)local_1b0);
      std::__cxx11::string::~string((string *)local_1b0);
      vs_code_specialized_raw = vs_code_specialized._M_dataplus._M_p;
      bVar7 = TestCaseBase::buildProgram
                        (&this->super_TestCaseBase,this->m_po_id,this->m_gs_id,1,
                         &gs_code_specialized_raw,this->m_vs_id,1,&vs_code_specialized_raw,
                         this->m_fs_id,1,&fs_code_specialized_raw,&has_shader_compilation_failed);
      if (bVar7) {
        (**(code **)(lVar11 + 0x868))(0x90df,&ssbo_alignment);
        dVar9 = (**(code **)(lVar11 + 0x800))();
        glu::checkError(dVar9,"glGetIntegerv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x7bf);
        GVar5 = ssbo_alignment;
        local_250 = (long)ssbo_alignment / 4 & 0xffffffff;
        uVar4 = *local_278;
        local_260 = (long)(int)(uVar4 * ssbo_alignment);
        uVar17 = 0xffffffffffffffff;
        if (-1 < (int)(uVar4 * ssbo_alignment)) {
          uVar17 = local_260 * 4;
        }
        pvVar14 = operator_new__(uVar17);
        if ((GVar5 & 3U) == 0) {
          iVar8 = 0;
          if ((int)uVar4 < 1) {
            uVar4 = 0;
          }
          uVar17 = 0;
          while (uVar4 != uVar17) {
            uVar17 = uVar17 + 1;
            *(int *)((long)pvVar14 + (long)iVar8 * 4) = (int)uVar17;
            iVar8 = iVar8 + (int)local_250;
          }
          pGVar3 = &this->m_ssbo_id;
          (**(code **)(lVar11 + 0x6c8))(1,pGVar3);
          dVar9 = (**(code **)(lVar11 + 0x800))();
          glu::checkError(dVar9,"glGenBuffers() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x7d9);
          (**(code **)(lVar11 + 0x40))(0x90d2,*pGVar3);
          dVar9 = (**(code **)(lVar11 + 0x800))();
          glu::checkError(dVar9,"glBindBuffer() call failed for GL_SHADER_STORAGE_BUFFER pname.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x7dc);
          (**(code **)(lVar11 + 0x150))(0x90d2,local_260,pvVar14,0x88ea);
          dVar9 = (**(code **)(lVar11 + 0x800))();
          glu::checkError(dVar9,"glBufferData() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x7df);
          local_258 = this;
          operator_delete__(pvVar14);
          for (iVar8 = 0; pGVar6 = local_258, iVar8 < *local_278; iVar8 = iVar8 + 1) {
            (**(code **)(lVar11 + 0x50))(0x90d2,iVar8,*pGVar3,ssbo_alignment * iVar8,4);
            dVar9 = (**(code **)(lVar11 + 0x800))();
            glu::checkError(dVar9,"bindBufferRange() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                            ,0x7eb);
          }
          pGVar3 = &local_258->m_vao_id;
          (**(code **)(lVar11 + 0x708))(1,pGVar3);
          dVar9 = (**(code **)(lVar11 + 0x800))();
          glu::checkError(dVar9,"glGenVertexArrays() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x7f0);
          (**(code **)(lVar11 + 0xd8))(*pGVar3);
          dVar9 = (**(code **)(lVar11 + 0x800))();
          glu::checkError(dVar9,"glBindVertexArray() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x7f3);
          pGVar3 = &pGVar6->m_tfbo_id;
          (**(code **)(lVar11 + 0x6c8))(1,pGVar3);
          dVar9 = (**(code **)(lVar11 + 0x800))();
          glu::checkError(dVar9,"glGenBuffers() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x7f7);
          (**(code **)(lVar11 + 0x40))(0x8892,*pGVar3);
          dVar9 = (**(code **)(lVar11 + 0x800))();
          glu::checkError(dVar9,"glBindBuffer() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x7fa);
          (**(code **)(lVar11 + 0x150))(0x8892,0x10,initial_buffer_data,0x88e5);
          dVar9 = (**(code **)(lVar11 + 0x800))();
          glu::checkError(dVar9,"glBufferData() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x7fe);
          (**(code **)(lVar11 + 0x48))(0x8c8e,0,*pGVar3);
          dVar9 = (**(code **)(lVar11 + 0x800))();
          glu::checkError(dVar9,"glBindBufferBase() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x802);
          (**(code **)(lVar11 + 0x1680))(pGVar6->m_po_id);
          dVar9 = (**(code **)(lVar11 + 0x800))();
          glu::checkError(dVar9,"glUseProgram() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x806);
          (**(code **)(lVar11 + 0x5e0))(0x8c89);
          dVar9 = (**(code **)(lVar11 + 0x800))();
          glu::checkError(dVar9,"glEnable() call failed for GL_RASTERIZER_DISCARD pname.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x80a);
          (**(code **)(lVar11 + 0x30))(0);
          dVar9 = (**(code **)(lVar11 + 0x800))();
          glu::checkError(dVar9,"glBeginTransformFeedback() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x80d);
          (**(code **)(lVar11 + 0x538))(0,0,1);
          dVar9 = (**(code **)(lVar11 + 0x800))();
          glu::checkError(dVar9,"glDrawArrays() call failed for GL_POINTS pname.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x810);
          (**(code **)(lVar11 + 0x638))();
          dVar9 = (**(code **)(lVar11 + 0x800))();
          glu::checkError(dVar9,"glEndTransformFeedback() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x813);
          (**(code **)(lVar11 + 0x4e8))(0x8c89);
          dVar9 = (**(code **)(lVar11 + 0x800))();
          glu::checkError(dVar9,"glDisable() call failed for GL_RASTERIZER_DISCARD pname.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x816);
          pfVar15 = (float *)(**(code **)(lVar11 + 0xd00))(0x8892,0,0x10,1);
          dVar9 = (**(code **)(lVar11 + 0x800))();
          glu::checkError(dVar9,"glMapBufferRange() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x81b);
          local_26c = *pfVar15;
          (**(code **)(lVar11 + 0x1670))(0x8892);
          dVar9 = (**(code **)(lVar11 + 0x800))();
          glu::checkError(dVar9,"glUnmapBuffer() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x820);
          lVar16 = (**(code **)(lVar11 + 0xd00))(0x90d2,0,local_260,1);
          dVar9 = (**(code **)(lVar11 + 0x800))();
          glu::checkError(dVar9,"glMapBufferRange() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x827);
          local_26c = (float)(int)(local_26c + 0.5);
          uVar4 = *local_278;
          local_260 = (long)(int)uVar4;
          iVar8 = 0;
          uVar17 = 0;
          if (0 < (int)uVar4) {
            uVar17 = (ulong)uVar4;
          }
          uVar2 = 1;
          do {
            uVar19 = uVar2;
            if (uVar19 - uVar17 == 1) goto LAB_00cd74d4;
            lVar18 = (long)iVar8;
            uVar2 = uVar19 + 1;
            iVar8 = iVar8 + (int)local_250;
          } while (uVar2 == *(uint *)(lVar16 + lVar18 * 4));
          local_1b0 = (undefined1  [8])
                      ((local_258->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->
                      m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::operator<<(&local_1a8,"Value read from Shader Storage Buffer [");
          pMVar12 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_1b0,(int *)(lVar18 * 4 + lVar16));
          poVar1 = &pMVar12->m_str;
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"] at index ["
                         );
          std::ostream::operator<<(poVar1,iVar8 - (int)local_250);
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                          "]is not equal to expected value [");
          std::ostream::operator<<(poVar1,(int)uVar2);
          std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"]");
          tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
LAB_00cd74d4:
          (**(code **)(lVar11 + 0x1670))(0x90d2);
          this = local_258;
          dVar9 = (**(code **)(lVar11 + 0x800))();
          glu::checkError(dVar9,"glUnmapBuffer() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x83e);
          if ((local_260 <= (long)(uVar19 - 1)) &&
             ((float)((int)((*local_278 + 1U) * *local_278) / 2) == local_26c)) {
            testResult = QP_TEST_RESULT_PASS;
            description = "Pass";
            goto LAB_00cd6f71;
          }
          goto LAB_00cd6f67;
        }
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::operator<<(&local_1a8,"GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT query value [");
        std::ostream::operator<<((ostringstream *)&local_1a8,ssbo_alignment);
        std::operator<<(&local_1a8,"]divide with remainder by the size of GLint [");
        std::ostream::operator<<((ostringstream *)&local_1a8,4);
        std::operator<<(&local_1a8,"]");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::operator<<(&local_1a8,"Program object linking failed.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  }
LAB_00cd6f67:
  testResult = QP_TEST_RESULT_FAIL;
  description = "Fail";
LAB_00cd6f71:
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,testResult,
             description);
  std::__cxx11::string::~string((string *)&vs_code_specialized);
  std::__cxx11::string::~string((string *)&gs_code_specialized);
  std::__cxx11::string::~string((string *)&fs_code_specialized);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderMaxShaderStorageBlocksTest::iterate()
{
	glw::GLint		   counter						 = 0;
	glw::GLint		   expectedValue				 = 0;
	const glw::GLchar* feedbackVaryings[]			 = { "gl_Position" };
	bool			   has_shader_compilation_failed = true;
	const glw::GLfloat initial_buffer_data[4]		 = { 0.0f, 0.0f, 0.0f, 0.0f };
	glw::GLint		   int_alignment				 = 0;
	const glw::GLint   int_size						 = sizeof(glw::GLint);
	glw::GLint*		   ptrSSBO_data					 = DE_NULL;
	glw::GLfloat*	  ptrTF_data					 = DE_NULL;
	bool			   result						 = true;
	glw::GLint		   ssbo_alignment				 = 0;
	glw::GLint*		   ssbo_data					 = DE_NULL;
	glw::GLint		   ssbo_data_size				 = 0;

	std::string fs_code_specialized		= "";
	const char* fs_code_specialized_raw = DE_NULL;
	std::string gs_code_specialized		= "";
	const char* gs_code_specialized_raw = DE_NULL;
	std::string vs_code_specialized		= "";
	const char* vs_code_specialized_raw = DE_NULL;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Retrieve GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT pname value */
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_SHADER_STORAGE_BLOCKS,
				   &m_gl_max_geometry_shader_storage_blocks_ext_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT pname");

	/* Retrieve GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS pname value */
	glw::GLint m_gl_max_shader_storage_buffer_bindings_value = 0;

	gl.getIntegerv(GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS, &m_gl_max_shader_storage_buffer_bindings_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS pname");

	/* Check if m_gl_max_shader_storage_blocks_value is less than or equal zero. */
	if (m_gl_max_geometry_shader_storage_blocks_ext_value <= 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT query value "
						   << "[" << m_gl_max_geometry_shader_storage_blocks_ext_value
						   << "]"
							  " is less than or equal zero. Shader Storage Blocks"
							  " in Geometry Shader are not supported."
						   << tcu::TestLog::EndMessage;

		if (m_gl_max_geometry_shader_storage_blocks_ext_value == 0)
		{
			throw tcu::NotSupportedError("GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT is 0");
		}
		else
		{
			result = false;
			goto end;
		}
	}

	/* Check if m_gl_max_shader_storage_buffer_bindings_value is less than m_gl_max_shader_storage_blocks_value. */
	if (m_gl_max_shader_storage_buffer_bindings_value < m_gl_max_geometry_shader_storage_blocks_ext_value)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT query value "
						   << "[" << m_gl_max_geometry_shader_storage_blocks_ext_value
						   << "]"
							  " is greater than GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS query value "
							  "["
						   << m_gl_max_shader_storage_buffer_bindings_value << "]." << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	/* Create a program object. */
	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	/* Create shader objects. */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	/* Configure which outputs should be captured by Transform Feedback. */
	gl.transformFeedbackVaryings(m_po_id, 1 /* varyings count */, feedbackVaryings, GL_INTERLEAVED_ATTRIBS);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed.");

	/* Try to link the test program object */
	fs_code_specialized		= specializeShader(1, &dummy_fs_code);
	fs_code_specialized_raw = fs_code_specialized.c_str();

	gs_code_specialized		= getGSCode();
	gs_code_specialized_raw = gs_code_specialized.c_str();

	vs_code_specialized		= specializeShader(1, &dummy_vs_code);
	vs_code_specialized_raw = vs_code_specialized.c_str();

	if (!TestCaseBase::buildProgram(m_po_id, m_gs_id, 1,				  /* n_sh1_body_parts */
									&gs_code_specialized_raw, m_vs_id, 1, /* n_sh2_body_parts */
									&vs_code_specialized_raw, m_fs_id, 1, /* n_sh3_body_parts */
									&fs_code_specialized_raw, &has_shader_compilation_failed))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Program object linking failed." << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	/* Prepare data for Shader Storage Buffer Object. */
	gl.getIntegerv(GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT, &ssbo_alignment);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed.");

	int_alignment  = ssbo_alignment / int_size;
	ssbo_data_size = m_gl_max_geometry_shader_storage_blocks_ext_value * ssbo_alignment;
	ssbo_data	  = new glw::GLint[ssbo_data_size];

	if ((ssbo_alignment % int_size) != 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT query value "
													   "["
						   << ssbo_alignment << "]"
												"divide with remainder by the size of GLint "
												"["
						   << int_size << "]" << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	for (int i = 0; i < m_gl_max_geometry_shader_storage_blocks_ext_value; ++i)
	{
		ssbo_data[i * int_alignment] = i + 1;
	}

	/* Create Shader Storage Buffer Object. */
	gl.genBuffers(1, &m_ssbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed for GL_SHADER_STORAGE_BUFFER pname.");

	gl.bufferData(GL_SHADER_STORAGE_BUFFER, ssbo_data_size, ssbo_data, GL_DYNAMIC_COPY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

	/* Free unused memory. */
	delete[] ssbo_data;
	ssbo_data = NULL;

	/* Bind specific m_ssbo_id buffer region to a specific Shader Storage Buffer binding point. */
	for (glw::GLint n_ssb = 0; n_ssb < (m_gl_max_geometry_shader_storage_blocks_ext_value); ++n_ssb)
	{
		glw::GLuint offset = n_ssb * ssbo_alignment;

		gl.bindBufferRange(GL_SHADER_STORAGE_BUFFER, n_ssb /*binding index*/, m_ssbo_id, offset, int_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "bindBufferRange() call failed.");
	}

	/* Configure VAO. */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");

	/* Create a Buffer Object for Transform Feedback's outputs. */
	gl.genBuffers(1, &m_tfbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_tfbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bufferData(GL_ARRAY_BUFFER, sizeof(glw::GLfloat) * 4 /* four float vector components */, initial_buffer_data,
				  GL_STATIC_READ);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

	/* Bind Buffer Object m_tfbo_id to GL_TRANSFORM_FEEDBACK_BUFFER binding point. */
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /*binding index*/, m_tfbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed.");

	/* Use program. */
	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	/* Disable rasterization and make a draw call. After that, turn on rasterization. */
	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable() call failed for GL_RASTERIZER_DISCARD pname.");

	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed.");

	gl.drawArrays(GL_POINTS, 0 /*starting index*/, 1 /*number of indices*/);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed for GL_POINTS pname.");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed.");

	gl.disable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable() call failed for GL_RASTERIZER_DISCARD pname.");

	/* Retrieve value from Transform Feedback. */
	ptrTF_data = (glw::GLfloat*)gl.mapBufferRange(
		GL_ARRAY_BUFFER, 0 /*offset*/, sizeof(glw::GLfloat) * 4 /* four float vector components */, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed.");

	counter = int(ptrTF_data[0] + 0.5f);

	gl.unmapBuffer(GL_ARRAY_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");

	ptrTF_data = NULL;

	/* Retrieve values from Shader Storage Buffer Object. */
	ptrSSBO_data =
		(glw::GLint*)gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0 /*offset*/, ssbo_data_size, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed.");

	for (int i = 0; i < m_gl_max_geometry_shader_storage_blocks_ext_value; ++i)
	{
		if (ptrSSBO_data[i * int_alignment] != i + 2)
		{
			result = false;

			m_testCtx.getLog() << tcu::TestLog::Message << "Value read from Shader Storage Buffer "
														   "["
							   << ptrSSBO_data[i * int_alignment] << "] "
																	 "at index "
																	 "["
							   << i * int_alignment << "]"
													   "is not equal to expected value "
													   "["
							   << i + 2 << "]" << tcu::TestLog::EndMessage;

			break;
		}
	}

	gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");

	ptrSSBO_data = NULL;

	/* Calculate expected value. */
	expectedValue =
		m_gl_max_geometry_shader_storage_blocks_ext_value * (m_gl_max_geometry_shader_storage_blocks_ext_value + 1) / 2;

	if (counter != expectedValue)
	{
		result = false;
	}

end:
	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}